

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_transport.c
# Opt level: O1

int tr_tcp_init(tr_tcp_config *config,tr_socket *socket)

{
  long lVar1;
  undefined4 *puVar2;
  char *pcVar3;
  uint uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  socket->close_fp = tr_tcp_close;
  socket->free_fp = tr_tcp_free;
  socket->open_fp = tr_tcp_open;
  socket->recv_fp = tr_tcp_recv;
  socket->send_fp = tr_tcp_send;
  socket->ident_fp = tr_tcp_ident;
  puVar2 = (undefined4 *)lrtr_malloc(0x40);
  socket->socket = puVar2;
  *puVar2 = 0xffffffff;
  pcVar3 = lrtr_strdup(config->host);
  *(char **)(puVar2 + 2) = pcVar3;
  pcVar3 = lrtr_strdup(config->port);
  *(char **)(puVar2 + 4) = pcVar3;
  if (config->bindaddr == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = lrtr_strdup(config->bindaddr);
  }
  *(char **)(puVar2 + 6) = pcVar3;
  uVar4 = 0x1e;
  if (config->connect_timeout != 0) {
    uVar4 = config->connect_timeout;
  }
  puVar2[0xc] = uVar4;
  *(undefined8 *)(puVar2 + 0xe) = 0;
  *(void **)(puVar2 + 8) = config->data;
  *(_func_int_void_ptr **)(puVar2 + 10) = config->new_socket;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT int tr_tcp_init(const struct tr_tcp_config *config, struct tr_socket *socket)
{
	socket->close_fp = &tr_tcp_close;
	socket->free_fp = &tr_tcp_free;
	socket->open_fp = &tr_tcp_open;
	socket->recv_fp = &tr_tcp_recv;
	socket->send_fp = &tr_tcp_send;
	socket->ident_fp = &tr_tcp_ident;

	socket->socket = lrtr_malloc(sizeof(struct tr_tcp_socket));
	struct tr_tcp_socket *tcp_socket = socket->socket;

	tcp_socket->socket = -1;
	tcp_socket->config.host = lrtr_strdup(config->host);
	tcp_socket->config.port = lrtr_strdup(config->port);
	if (config->bindaddr)
		tcp_socket->config.bindaddr = lrtr_strdup(config->bindaddr);
	else
		tcp_socket->config.bindaddr = NULL;

	if (config->connect_timeout == 0)
		tcp_socket->config.connect_timeout = RTRLIB_TRANSPORT_CONNECT_TIMEOUT_DEFAULT;
	else
		tcp_socket->config.connect_timeout = config->connect_timeout;

	tcp_socket->ident = NULL;
	tcp_socket->config.data = config->data;
	tcp_socket->config.new_socket = config->new_socket;

	return TR_SUCCESS;
}